

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O2

void Mvc_CoverDivideByCube
               (Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  int *piVar1;
  int iVar2;
  Mvc_Cover_t *pCover_00;
  Mvc_Cover_t *pCover_01;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pMVar4;
  uint uVar5;
  Mvc_Cover_t *pMVar6;
  Mvc_Cube_t *pMVar7;
  Mvc_List_t *pList;
  Mvc_List_t *pList_1;
  Mvc_Cube_t *pCube;
  
  iVar2 = Mvc_CoverReadCubeNum(pDiv);
  if (iVar2 != 1) {
    __assert_fail("Mvc_CoverReadCubeNum(pDiv) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                  ,0x114,
                  "void Mvc_CoverDivideByCube(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                 );
  }
  pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pCover_01 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pMVar3 = Mvc_CoverReadCubeHead(pDiv);
  pCube = (Mvc_Cube_t *)&pCover->lCubes;
  while (pCube = pCube->pNext, pCube != (Mvc_Cube_t *)0x0) {
    if (((pMVar3->pData[0] & ~pCube->pData[0]) == 0) &&
       ((*(uint *)&pMVar3->field_0x14 & ~*(uint *)&pCube->field_0x14) == 0)) {
      pMVar4 = Mvc_CubeAlloc(pCover_00);
      uVar5 = *(uint *)&pCube->field_0x8 & 0xffffff;
      if (uVar5 == 0) {
        pMVar4->pData[0] = ~pMVar3->pData[0] & pCube->pData[0];
      }
      else if (uVar5 == 1) {
        pMVar4->pData[0] = ~pMVar3->pData[0] & pCube->pData[0];
        *(uint *)&pMVar4->field_0x14 = ~*(uint *)&pMVar3->field_0x14 & *(uint *)&pCube->field_0x14;
      }
      else {
        for (; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
          pMVar4->pData[uVar5] = ~pMVar3->pData[uVar5] & pCube->pData[uVar5];
        }
      }
      pMVar7 = (Mvc_Cube_t *)&pCover_00->lCubes;
      if ((pCover_00->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar7 = (pCover_00->lCubes).pTail;
      }
      pMVar7->pNext = pMVar4;
      (pCover_00->lCubes).pTail = pMVar4;
      pMVar6 = pCover_00;
    }
    else {
      pMVar4 = Mvc_CubeDup(pCover_01,pCube);
      pMVar7 = (Mvc_Cube_t *)&pCover_01->lCubes;
      if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar7 = (pCover_01->lCubes).pTail;
      }
      pMVar7->pNext = pMVar4;
      (pCover_01->lCubes).pTail = pMVar4;
      pMVar6 = pCover_01;
    }
    pMVar4->pNext = (Mvc_Cube_t *)0x0;
    piVar1 = &(pMVar6->lCubes).nItems;
    *piVar1 = *piVar1 + 1;
  }
  *ppRem = pCover_01;
  *ppQuo = pCover_00;
  return;
}

Assistant:

void Mvc_CoverDivideByCube( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    Mvc_Cover_t * pQuo, * pRem;
    Mvc_Cube_t * pCubeC, * pCubeD, * pCubeCopy;
    int CompResult;

    // get the only cube of D
    assert( Mvc_CoverReadCubeNum(pDiv) == 1 );

    // start the quotient and the remainder
    pQuo = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pRem = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );

    // get the first and only cube of the divisor
    pCubeD = Mvc_CoverReadCubeHead( pDiv );

    // iterate through the cubes in the cover
    Mvc_CoverForEachCube( pCover, pCubeC )
    {
        // check the containment of literals from pCubeD in pCube
        Mvc_Cube2BitNotImpl( CompResult, pCubeD, pCubeC );
        if ( !CompResult )
        { // this cube belongs to the quotient
            // alloc the cube
            pCubeCopy = Mvc_CubeAlloc( pQuo );
            // clean the support of D
            Mvc_CubeBitSharp( pCubeCopy, pCubeC, pCubeD );
            // add the cube to the quotient
            Mvc_CoverAddCubeTail( pQuo, pCubeCopy );
        }
        else
        { 
            // copy the cube
            pCubeCopy = Mvc_CubeDup( pRem, pCubeC );
            // add the cube to the remainder
            Mvc_CoverAddCubeTail( pRem, pCubeCopy );
        }
    }
    // return the results
    *ppRem = pRem;
    *ppQuo = pQuo;
}